

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O0

void R_InitVoxels(void)

{
  bool bVar1;
  uint uVar2;
  FVoxelDef *this;
  uint *puVar3;
  int local_178;
  int j;
  int frame;
  int sprnum;
  uint i;
  FVoxelDef *def;
  VoxelOptions opts;
  FVoxel *pFStack_138;
  int voxelfile;
  FVoxel *voxeldata;
  undefined1 local_120 [8];
  TArray<unsigned_int,_unsigned_int> vsprites;
  FScanner sc;
  int lastlump;
  int lump;
  
  sc.LastGotLine = 0;
  while (sc._252_4_ = FWadCollection::FindLump(&Wads,"VOXELDEF",&sc.LastGotLine,false),
        sc._252_4_ != -1) {
    FScanner::FScanner((FScanner *)&vsprites.Most,sc._252_4_);
    TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)local_120);
    while (bVar1 = VOX_ReadSpriteNames((FScanner *)&vsprites.Most,
                                       (TArray<unsigned_int,_unsigned_int> *)local_120), bVar1) {
      pFStack_138 = (FVoxel *)0x0;
      VoxelOptions::VoxelOptions((VoxelOptions *)&def);
      FScanner::SetCMode((FScanner *)&vsprites.Most,true);
      FScanner::MustGetToken((FScanner *)&vsprites.Most,0x102);
      opts._28_4_ = FWadCollection::CheckNumForFullName(&Wads,(char *)vsprites._8_8_,true,0xb);
      if ((int)opts._28_4_ < 0) {
        FScanner::ScriptMessage
                  ((FScanner *)&vsprites.Most,"Voxel \"%s\" not found.\n",vsprites._8_8_);
      }
      else {
        pFStack_138 = VOX_GetVoxel(opts._28_4_);
        if (pFStack_138 == (FVoxel *)0x0) {
          FScanner::ScriptMessage
                    ((FScanner *)&vsprites.Most,"\"%s\" is not a valid voxel file.\n",vsprites._8_8_
                    );
        }
      }
      bVar1 = FScanner::CheckToken((FScanner *)&vsprites.Most,0x7b);
      if (bVar1) {
        VOX_ReadOptions((FScanner *)&vsprites.Most,(VoxelOptions *)&def);
      }
      FScanner::SetCMode((FScanner *)&vsprites.Most,false);
      if ((pFStack_138 != (FVoxel *)0x0) &&
         (uVar2 = TArray<unsigned_int,_unsigned_int>::Size
                            ((TArray<unsigned_int,_unsigned_int> *)local_120), uVar2 != 0)) {
        if ((opts.AngleOffset.Degrees._0_1_ & 1) != 0) {
          FVoxel::RemovePalette(pFStack_138);
        }
        this = (FVoxelDef *)operator_new(0x28);
        FVoxelDef::FVoxelDef(this);
        this->Voxel = pFStack_138;
        this->Scale = (double)opts._0_8_;
        this->DroppedSpin = (int)def;
        this->PlacedSpin = def._4_4_;
        _sprnum = this;
        TAngle<double>::operator=(&this->AngleOffset,(TAngle<double> *)&opts.Scale);
        TArray<FVoxelDef_*,_FVoxelDef_*>::Push
                  (&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,(FVoxelDef **)&sprnum);
        for (frame = 0;
            uVar2 = TArray<unsigned_int,_unsigned_int>::Size
                              ((TArray<unsigned_int,_unsigned_int> *)local_120), (uint)frame < uVar2
            ; frame = frame + 1) {
          puVar3 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)local_120,(ulong)(uint)frame);
          uVar2 = *puVar3;
          puVar3 = TArray<unsigned_int,_unsigned_int>::operator[]
                             ((TArray<unsigned_int,_unsigned_int> *)local_120,(ulong)(uint)frame);
          if (*puVar3 >> 0x18 == 0xff) {
            for (local_178 = 0x1c; -1 < local_178; local_178 = local_178 + -1) {
              VOX_AddVoxel(uVar2 & 0xffffff,local_178,_sprnum);
            }
          }
          else {
            VOX_AddVoxel(uVar2 & 0xffffff,*puVar3 >> 0x18,_sprnum);
          }
        }
      }
    }
    TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)local_120);
    FScanner::~FScanner((FScanner *)&vsprites.Most);
  }
  return;
}

Assistant:

void R_InitVoxels()
{
	int lump, lastlump = 0;
	
	while ((lump = Wads.FindLump("VOXELDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		TArray<DWORD> vsprites;

		while (VOX_ReadSpriteNames(sc, vsprites))
		{
			FVoxel *voxeldata = NULL;
			int voxelfile;
			VoxelOptions opts;

			sc.SetCMode(true);
			sc.MustGetToken(TK_StringConst);
			voxelfile = Wads.CheckNumForFullName(sc.String, true, ns_voxels);
			if (voxelfile < 0)
			{
				sc.ScriptMessage("Voxel \"%s\" not found.\n", sc.String);
			}
			else
			{
				voxeldata = VOX_GetVoxel(voxelfile);
				if (voxeldata == NULL)
				{
					sc.ScriptMessage("\"%s\" is not a valid voxel file.\n", sc.String);
				}
			}
			if (sc.CheckToken('{'))
			{
				VOX_ReadOptions(sc, opts);
			}
			sc.SetCMode(false);
			if (voxeldata != NULL && vsprites.Size() != 0)
			{
				if (opts.OverridePalette)
				{
					voxeldata->RemovePalette();
				}
				FVoxelDef *def = new FVoxelDef;

				def->Voxel = voxeldata;
				def->Scale = opts.Scale;
				def->DroppedSpin = opts.DroppedSpin;
				def->PlacedSpin = opts.PlacedSpin;
				def->AngleOffset = opts.AngleOffset;
				VoxelDefs.Push(def);

				for (unsigned i = 0; i < vsprites.Size(); ++i)
				{
					int sprnum = int(vsprites[i] & 0xFFFFFF);
					int frame = int(vsprites[i] >> 24);
					if (frame == 255)
					{ // Apply voxel to all frames.
						for (int j = MAX_SPRITE_FRAMES - 1; j >= 0; --j)
						{
							VOX_AddVoxel(sprnum, j, def);
						}
					}
					else
					{ // Apply voxel to only one frame.
						VOX_AddVoxel(sprnum, frame, def);
					}
				}
			}
		}
	}
}